

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv32_impl.h
# Opt level: O3

int secp256k1_jacobi32_maybe_var(secp256k1_modinv32_signed30 *x,secp256k1_modinv32_modinfo *modinfo)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  byte bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  secp256k1_modinv32_trans2x2 t;
  secp256k1_modinv32_signed30 f;
  secp256k1_modinv32_signed30 g;
  int local_a4;
  secp256k1_modinv32_trans2x2 local_a0;
  undefined8 local_90;
  secp256k1_modinv32_signed30 local_88;
  int iStack_5c;
  secp256k1_modinv32_signed30 local_58;
  
  local_88.v[8] = (modinfo->modulus).v[8];
  local_88.v._0_8_ = *(undefined8 *)(modinfo->modulus).v;
  local_88.v._8_8_ = *(undefined8 *)((modinfo->modulus).v + 2);
  local_88.v._16_8_ = *(undefined8 *)((modinfo->modulus).v + 4);
  local_88.v._24_8_ = *(undefined8 *)((modinfo->modulus).v + 6);
  local_58.v[8] = x->v[8];
  local_58.v._0_8_ = *(undefined8 *)x->v;
  local_58.v._8_8_ = *(undefined8 *)(x->v + 2);
  local_58.v._16_8_ = *(undefined8 *)(x->v + 4);
  local_58.v._24_8_ = *(undefined8 *)(x->v + 6);
  uVar7 = 9;
  iVar13 = -1;
  iVar9 = 0;
  uVar14 = 0;
  do {
    uVar11 = 0;
    if ((local_58.v[0] | 0xc0000000U) != 0) {
      for (; ((local_58.v[0] | 0xc0000000U) >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
      }
    }
    iVar13 = iVar13 - uVar11;
    uVar14 = ((uint)local_88.v[0] >> 2 ^ (uint)local_88.v[0] >> 1) & uVar11 ^ uVar14;
    if (uVar11 == 0x1e) {
      local_a0.u = 0x40000000;
      local_a4 = 1;
      local_a0.q = 0;
      local_a0.v = 0;
    }
    else {
      uVar6 = local_88.v[1] << 0x1e | local_88.v[0];
      local_a4 = 1;
      local_a0.u = 1 << ((byte)uVar11 & 0x1f);
      uVar10 = (uint)(local_58.v[1] << 0x1e | local_58.v[0]) >> ((byte)uVar11 & 0x1f);
      iVar5 = 0x1e - uVar11;
      local_a0.v = 0;
      local_a0.q = 0;
      do {
        uVar11 = uVar10;
        iVar15 = local_a0.u;
        iVar12 = local_a0.v;
        if (iVar13 < 0) {
          iVar13 = -iVar13;
          uVar14 = uVar14 ^ (uVar6 & uVar10) >> 1;
          uVar11 = uVar6;
          iVar15 = local_a0.q;
          uVar6 = uVar10;
          local_a0.q = local_a0.u;
          iVar12 = local_a4;
          local_a4 = local_a0.v;
        }
        iVar2 = iVar13 + 1;
        if (iVar5 <= iVar13 + 1) {
          iVar2 = iVar5;
        }
        uVar3 = ((uint)(byte)(secp256k1_modinv32_inv256[uVar6 >> 1 & 0x7f] * (char)uVar11) <<
                (-(char)iVar2 & 0x1fU)) >> (-(char)iVar2 & 0x1fU);
        uVar11 = uVar3 * uVar6 + uVar11;
        local_a0.q = uVar3 * iVar15 + local_a0.q;
        uVar10 = -1 << ((byte)iVar5 & 0x1f) | uVar11;
        uVar1 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> uVar1 & 1) == 0; uVar1 = uVar1 + 1) {
          }
        }
        bVar4 = (byte)uVar1;
        uVar10 = uVar11 >> (bVar4 & 0x1f);
        local_a0.u = iVar15 << (bVar4 & 0x1f);
        local_a0.v = iVar12 << (bVar4 & 0x1f);
        local_a4 = uVar3 * iVar12 + local_a4;
        iVar13 = iVar13 - uVar1;
        uVar14 = uVar14 ^ (uVar6 >> 2 ^ uVar6 >> 1) & uVar1;
        iVar5 = iVar5 - uVar1;
      } while (iVar5 != 0);
    }
    uVar11 = (uint)uVar7;
    local_a0.r = local_a4;
    local_90 = uVar7;
    secp256k1_modinv32_update_fg_30_var(uVar11,&local_88,&local_58,&local_a0);
    if (local_88.v[0] == 1) {
      if ((int)uVar11 < 2) {
LAB_001606bc:
        return 1 - (uVar14 * 2 & 2);
      }
      uVar6 = 0;
      uVar8 = 1;
      do {
        uVar6 = uVar6 | local_88.v[uVar8];
        uVar8 = uVar8 + 1;
      } while (uVar7 != uVar8);
      if (uVar6 == 0) goto LAB_001606bc;
    }
    uVar6 = uVar11 - 1;
    if (((int)(uVar11 - 2) < 0 || *(int *)((long)&local_90 + (long)(int)uVar11 * 4 + 4) != 0) ||
        (&iStack_5c)[(int)uVar11] != 0) {
      uVar6 = uVar11;
    }
    iVar9 = iVar9 + 1;
    uVar7 = (ulong)uVar6;
    if (iVar9 == 0x32) {
      return 0;
    }
  } while( true );
}

Assistant:

static int secp256k1_jacobi32_maybe_var(const secp256k1_modinv32_signed30 *x, const secp256k1_modinv32_modinfo *modinfo) {
    /* Start with f=modulus, g=x, eta=-1. */
    secp256k1_modinv32_signed30 f = modinfo->modulus;
    secp256k1_modinv32_signed30 g = *x;
    int j, len = 9;
    int32_t eta = -1; /* eta = -delta; delta is initially 1 */
    int32_t cond, fn, gn;
    int jac = 0;
    int count;

    /* The input limbs must all be non-negative. */
    VERIFY_CHECK(g.v[0] >= 0 && g.v[1] >= 0 && g.v[2] >= 0 && g.v[3] >= 0 && g.v[4] >= 0 && g.v[5] >= 0 && g.v[6] >= 0 && g.v[7] >= 0 && g.v[8] >= 0);

    /* If x > 0, then if the loop below converges, it converges to f=g=gcd(x,modulus). Since we
     * require that gcd(x,modulus)=1 and modulus>=3, x cannot be 0. Thus, we must reach f=1 (or
     * time out). */
    VERIFY_CHECK((g.v[0] | g.v[1] | g.v[2] | g.v[3] | g.v[4] | g.v[5] | g.v[6] | g.v[7] | g.v[8]) != 0);

    for (count = 0; count < JACOBI32_ITERATIONS; ++count) {
        /* Compute transition matrix and new eta after 30 posdivsteps. */
        secp256k1_modinv32_trans2x2 t;
        eta = secp256k1_modinv32_posdivsteps_30_var(eta, f.v[0] | ((uint32_t)f.v[1] << 30), g.v[0] | ((uint32_t)g.v[1] << 30), &t, &jac);
        /* Update f,g using that transition matrix. */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */

        secp256k1_modinv32_update_fg_30_var(len, &f, &g, &t);
        /* If the bottom limb of f is 1, there is a chance that f=1. */
        if (f.v[0] == 1) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= f.v[j];
            }
            /* If so, we're done. If f=1, the Jacobi symbol (g | f)=1. */
            if (cond == 0) return 1 - 2*(jac & 1);
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int32_t)len - 2) >> 31;
        cond |= fn;
        cond |= gn;
        /* If so, reduce length. */
        if (cond == 0) --len;

        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 0) > 0); /* f > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 0) > 0); /* g > 0 */
        VERIFY_CHECK(secp256k1_modinv32_mul_cmp_30(&g, len, &modinfo->modulus, 1) < 0);  /* g < modulus */
    }

    /* The loop failed to converge to f=g after 1500 iterations. Return 0, indicating unknown result. */
    return 0;
}